

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

void secp256k1_modinv64_update_de_62
               (secp256k1_modinv64_signed62 *d,secp256k1_modinv64_signed62 *e,
               secp256k1_modinv64_trans2x2 *t,secp256k1_modinv64_modinfo *modinfo)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  int64_t *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  secp256k1_int128 ce;
  secp256k1_int128 cd;
  int64_t se;
  int64_t sd;
  int64_t me;
  int64_t md;
  int64_t r;
  int64_t q;
  int64_t v;
  int64_t u;
  int64_t e4;
  int64_t e3;
  int64_t e2;
  int64_t e1;
  int64_t e0;
  int64_t d4;
  int64_t d3;
  int64_t d2;
  int64_t d1;
  int64_t d0;
  uint64_t M62;
  secp256k1_int128 local_d8;
  secp256k1_int128 local_c8;
  ulong local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  int64_t *local_20;
  ulong *local_10;
  ulong *local_8;
  
  local_28 = 0x3fffffffffffffff;
  local_30 = *in_RDI;
  local_38 = in_RDI[1];
  local_40 = in_RDI[2];
  local_48 = in_RDI[3];
  local_50 = in_RDI[4];
  local_58 = *in_RSI;
  local_60 = in_RSI[1];
  local_68 = in_RSI[2];
  local_70 = in_RSI[3];
  local_78 = in_RSI[4];
  local_80 = *in_RDX;
  local_88 = in_RDX[1];
  local_90 = in_RDX[2];
  local_98 = in_RDX[3];
  local_b0 = (long)local_50 >> 0x3f;
  local_b8 = (long)local_78 >> 0x3f;
  local_a0 = (local_80 & local_b0) + (local_88 & local_b8);
  local_a8 = (local_90 & local_b0) + (local_98 & local_b8);
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_i128_mul(&local_c8,local_80,local_30);
  secp256k1_i128_accum_mul(&local_c8,local_88,local_58);
  secp256k1_i128_mul(&local_d8,local_90,local_30);
  secp256k1_i128_accum_mul(&local_d8,local_98,local_58);
  lVar1 = local_20[5];
  uVar2 = secp256k1_i128_to_u64(&local_c8);
  local_a0 = local_a0 - (lVar1 * uVar2 + local_a0 & 0x3fffffffffffffff);
  lVar1 = local_20[5];
  uVar2 = secp256k1_i128_to_u64(&local_d8);
  local_a8 = local_a8 - (lVar1 * uVar2 + local_a8 & 0x3fffffffffffffff);
  secp256k1_i128_accum_mul(&local_c8,*local_20,local_a0);
  secp256k1_i128_accum_mul(&local_d8,*local_20,local_a8);
  secp256k1_i128_rshift(&local_c8,0x3e);
  secp256k1_i128_rshift(&local_d8,0x3e);
  secp256k1_i128_accum_mul(&local_c8,local_80,local_38);
  secp256k1_i128_accum_mul(&local_c8,local_88,local_60);
  secp256k1_i128_accum_mul(&local_d8,local_90,local_38);
  secp256k1_i128_accum_mul(&local_d8,local_98,local_60);
  if (local_20[1] != 0) {
    secp256k1_i128_accum_mul(&local_c8,local_20[1],local_a0);
    secp256k1_i128_accum_mul(&local_d8,local_20[1],local_a8);
  }
  uVar2 = secp256k1_i128_to_u64(&local_c8);
  *local_8 = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_c8,0x3e);
  uVar2 = secp256k1_i128_to_u64(&local_d8);
  *local_10 = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_d8,0x3e);
  secp256k1_i128_accum_mul(&local_c8,local_80,local_40);
  secp256k1_i128_accum_mul(&local_c8,local_88,local_68);
  secp256k1_i128_accum_mul(&local_d8,local_90,local_40);
  secp256k1_i128_accum_mul(&local_d8,local_98,local_68);
  if (local_20[2] != 0) {
    secp256k1_i128_accum_mul(&local_c8,local_20[2],local_a0);
    secp256k1_i128_accum_mul(&local_d8,local_20[2],local_a8);
  }
  uVar2 = secp256k1_i128_to_u64(&local_c8);
  local_8[1] = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_c8,0x3e);
  uVar2 = secp256k1_i128_to_u64(&local_d8);
  local_10[1] = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_d8,0x3e);
  secp256k1_i128_accum_mul(&local_c8,local_80,local_48);
  secp256k1_i128_accum_mul(&local_c8,local_88,local_70);
  secp256k1_i128_accum_mul(&local_d8,local_90,local_48);
  secp256k1_i128_accum_mul(&local_d8,local_98,local_70);
  if (local_20[3] != 0) {
    secp256k1_i128_accum_mul(&local_c8,local_20[3],local_a0);
    secp256k1_i128_accum_mul(&local_d8,local_20[3],local_a8);
  }
  uVar2 = secp256k1_i128_to_u64(&local_c8);
  local_8[2] = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_c8,0x3e);
  uVar2 = secp256k1_i128_to_u64(&local_d8);
  local_10[2] = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_d8,0x3e);
  secp256k1_i128_accum_mul(&local_c8,local_80,local_50);
  secp256k1_i128_accum_mul(&local_c8,local_88,local_78);
  secp256k1_i128_accum_mul(&local_d8,local_90,local_50);
  secp256k1_i128_accum_mul(&local_d8,local_98,local_78);
  secp256k1_i128_accum_mul(&local_c8,local_20[4],local_a0);
  secp256k1_i128_accum_mul(&local_d8,local_20[4],local_a8);
  uVar2 = secp256k1_i128_to_u64(&local_c8);
  local_8[3] = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_c8,0x3e);
  uVar2 = secp256k1_i128_to_u64(&local_d8);
  local_10[3] = uVar2 & 0x3fffffffffffffff;
  secp256k1_i128_rshift(&local_d8,0x3e);
  uVar3 = secp256k1_i128_to_i64(&local_c8);
  local_8[4] = uVar3;
  uVar3 = secp256k1_i128_to_i64(&local_d8);
  local_10[4] = uVar3;
  return;
}

Assistant:

static void secp256k1_modinv64_update_de_62(secp256k1_modinv64_signed62 *d, secp256k1_modinv64_signed62 *e, const secp256k1_modinv64_trans2x2 *t, const secp256k1_modinv64_modinfo* modinfo) {
    const uint64_t M62 = UINT64_MAX >> 2;
    const int64_t d0 = d->v[0], d1 = d->v[1], d2 = d->v[2], d3 = d->v[3], d4 = d->v[4];
    const int64_t e0 = e->v[0], e1 = e->v[1], e2 = e->v[2], e3 = e->v[3], e4 = e->v[4];
    const int64_t u = t->u, v = t->v, q = t->q, r = t->r;
    int64_t md, me, sd, se;
    secp256k1_int128 cd, ce;
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_abs(u) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(v))); /* |u|+|v| <= 2^62 */
    VERIFY_CHECK(secp256k1_modinv64_abs(q) <= (((int64_t)1 << 62) - secp256k1_modinv64_abs(r))); /* |q|+|r| <= 2^62 */

    /* [md,me] start as zero; plus [u,q] if d is negative; plus [v,r] if e is negative. */
    sd = d4 >> 63;
    se = e4 >> 63;
    md = (u & sd) + (v & se);
    me = (q & sd) + (r & se);
    /* Begin computing t*[d,e]. */
    secp256k1_i128_mul(&cd, u, d0);
    secp256k1_i128_accum_mul(&cd, v, e0);
    secp256k1_i128_mul(&ce, q, d0);
    secp256k1_i128_accum_mul(&ce, r, e0);
    /* Correct md,me so that t*[d,e]+modulus*[md,me] has 62 zero bottom bits. */
    md -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&cd) + md) & M62;
    me -= (modinfo->modulus_inv62 * secp256k1_i128_to_u64(&ce) + me) & M62;
    /* Update the beginning of computation for t*[d,e]+modulus*[md,me] now md,me are known. */
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[0], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[0], me);
    /* Verify that the low 62 bits of the computation are indeed zero, and then throw them away. */
    VERIFY_CHECK((secp256k1_i128_to_u64(&cd) & M62) == 0); secp256k1_i128_rshift(&cd, 62);
    VERIFY_CHECK((secp256k1_i128_to_u64(&ce) & M62) == 0); secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 1 of t*[d,e]+modulus*[md,me], and store it as output limb 0 (= down shift). */
    secp256k1_i128_accum_mul(&cd, u, d1);
    secp256k1_i128_accum_mul(&cd, v, e1);
    secp256k1_i128_accum_mul(&ce, q, d1);
    secp256k1_i128_accum_mul(&ce, r, e1);
    if (modinfo->modulus.v[1]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[1], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[1], me);
    }
    d->v[0] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[0] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 2 of t*[d,e]+modulus*[md,me], and store it as output limb 1. */
    secp256k1_i128_accum_mul(&cd, u, d2);
    secp256k1_i128_accum_mul(&cd, v, e2);
    secp256k1_i128_accum_mul(&ce, q, d2);
    secp256k1_i128_accum_mul(&ce, r, e2);
    if (modinfo->modulus.v[2]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[2], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[2], me);
    }
    d->v[1] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[1] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 3 of t*[d,e]+modulus*[md,me], and store it as output limb 2. */
    secp256k1_i128_accum_mul(&cd, u, d3);
    secp256k1_i128_accum_mul(&cd, v, e3);
    secp256k1_i128_accum_mul(&ce, q, d3);
    secp256k1_i128_accum_mul(&ce, r, e3);
    if (modinfo->modulus.v[3]) { /* Optimize for the case where limb of modulus is zero. */
        secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[3], md);
        secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[3], me);
    }
    d->v[2] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[2] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* Compute limb 4 of t*[d,e]+modulus*[md,me], and store it as output limb 3. */
    secp256k1_i128_accum_mul(&cd, u, d4);
    secp256k1_i128_accum_mul(&cd, v, e4);
    secp256k1_i128_accum_mul(&ce, q, d4);
    secp256k1_i128_accum_mul(&ce, r, e4);
    secp256k1_i128_accum_mul(&cd, modinfo->modulus.v[4], md);
    secp256k1_i128_accum_mul(&ce, modinfo->modulus.v[4], me);
    d->v[3] = secp256k1_i128_to_u64(&cd) & M62; secp256k1_i128_rshift(&cd, 62);
    e->v[3] = secp256k1_i128_to_u64(&ce) & M62; secp256k1_i128_rshift(&ce, 62);
    /* What remains is limb 5 of t*[d,e]+modulus*[md,me]; store it as output limb 4. */
    d->v[4] = secp256k1_i128_to_i64(&cd);
    e->v[4] = secp256k1_i128_to_i64(&ce);

    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, -2) > 0); /* d > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(d, 5, &modinfo->modulus, 1) < 0);  /* d <    modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, -2) > 0); /* e > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(e, 5, &modinfo->modulus, 1) < 0);  /* e <    modulus */
}